

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess_unix.cpp
# Opt level: O2

bool __thiscall QProcessPrivate::processStarted(QProcessPrivate *this,QString *errorMessage)

{
  long lVar1;
  QObject *receiver;
  qsizetype qVar2;
  QSocketNotifier *pQVar3;
  Data *pDVar4;
  char16_t *pcVar5;
  qint64 qVar6;
  ssize_t bytesRead;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_248;
  Connection local_230;
  ChildError buf;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  receiver = (this->super_QIODevicePrivate).super_QObjectPrivate.super_QObjectData.q_ptr;
  memset(&buf,0xaa,0x200);
  qVar6 = qt_safe_read(this->childStartedPipe[0],&buf,0x200);
  if (this->stateNotifier != (QSocketNotifier *)0x0) {
    QSocketNotifier::setEnabled(this->stateNotifier,false);
    QObject::disconnect(&this->stateNotifier->super_QObject,receiver,(char *)0x0);
  }
  qt_safe_close(this->childStartedPipe[0]);
  this->childStartedPipe[0] = -1;
  if (qVar6 < 1) {
    if ((sockaddr *)this->stateNotifier != (sockaddr *)0x0) {
      QObject::connect((int)&local_230,(sockaddr *)this->stateNotifier,0x53a977);
      QMetaObject::Connection::~Connection(&local_230);
      QSocketNotifier::setSocket(this->stateNotifier,(long)this->forkfd);
      QSocketNotifier::setEnabled(this->stateNotifier,true);
    }
    pQVar3 = (this->stdoutChannel).notifier;
    if (pQVar3 != (QSocketNotifier *)0x0) {
      QSocketNotifier::setEnabled(pQVar3,true);
    }
    pQVar3 = (this->stderrChannel).notifier;
    if (pQVar3 != (QSocketNotifier *)0x0) {
      QSocketNotifier::setEnabled(pQVar3,true);
    }
  }
  else if (errorMessage != (QString *)0x0) {
    anon_unknown.dwarf_133c8f4::startFailureErrorMessage((QString *)&local_248,&buf,bytesRead);
    pDVar4 = (errorMessage->d).d;
    pcVar5 = (errorMessage->d).ptr;
    (errorMessage->d).d = local_248.d;
    (errorMessage->d).ptr = local_248.ptr;
    qVar2 = (errorMessage->d).size;
    (errorMessage->d).size = local_248.size;
    local_248.d = pDVar4;
    local_248.ptr = pcVar5;
    local_248.size = qVar2;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_248);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return qVar6 < 1;
  }
  __stack_chk_fail();
}

Assistant:

bool QProcessPrivate::processStarted(QString *errorMessage)
{
    Q_Q(QProcess);

    ChildError buf;
    ssize_t ret = qt_safe_read(childStartedPipe[0], &buf, sizeof(buf));

    if (stateNotifier) {
        stateNotifier->setEnabled(false);
        stateNotifier->disconnect(q);
    }
    qt_safe_close(childStartedPipe[0]);
    childStartedPipe[0] = -1;

#if defined (QPROCESS_DEBUG)
    qDebug("QProcessPrivate::processStarted() == %s", ret <= 0 ? "true" : "false");
#endif

    if (ret <= 0) {  // process successfully started
        if (stateNotifier) {
            QObject::connect(stateNotifier, SIGNAL(activated(QSocketDescriptor)),
                             q, SLOT(_q_processDied()));
            stateNotifier->setSocket(forkfd);
            stateNotifier->setEnabled(true);
        }
        if (stdoutChannel.notifier)
            stdoutChannel.notifier->setEnabled(true);
        if (stderrChannel.notifier)
            stderrChannel.notifier->setEnabled(true);

        return true;
    }

    // did we read an error message?
    if (errorMessage)
        *errorMessage = startFailureErrorMessage(buf, ret);

    return false;
}